

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O1

BinaryExpr * new_binary_expr(void *left,Token *op,void *right)

{
  Token *pTVar1;
  void *pvVar2;
  BinaryExpr *pBVar3;
  undefined8 *puVar4;
  
  pvVar2 = malloc(0x20);
  pBVar3 = (BinaryExpr *)require_not_null(pvVar2,"Failed to allocate space");
  pvVar2 = malloc(0x10);
  puVar4 = (undefined8 *)require_not_null(pvVar2,"Failed to allocate space");
  puVar4[1] = op;
  *puVar4 = binary_eval;
  pTVar1 = (Token *)puVar4[1];
  (pBVar3->node).eval = (eval_handler_)*puVar4;
  (pBVar3->node).token = pTVar1;
  pBVar3->left = left;
  pBVar3->right = right;
  return pBVar3;
}

Assistant:

BinaryExpr *new_binary_expr(void *left, Token *op, void *right) {
    BinaryExpr *expr = new(BinaryExpr);
    expr->node = tree_node_(op, eval_handler(binary_eval));
    expr->left = left;
    expr->right = right;
    return expr;
}